

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLReader.cpp
# Opt level: O0

void __thiscall xercesc_4_0::XMLReader::checkForSwapped(XMLReader *this)

{
  XMLReader *this_local;
  
  this->fSwapped = false;
  if ((XMLPlatformUtils::fgXMLChBigEndian & 1) == 0) {
    if ((this->fEncoding == UTF_16B) || (this->fEncoding == UCS_4B)) {
      this->fSwapped = true;
    }
  }
  else if ((this->fEncoding == UTF_16L) || (this->fEncoding == UCS_4L)) {
    this->fSwapped = true;
  }
  return;
}

Assistant:

void XMLReader::checkForSwapped()
{
    // Assume not swapped
    fSwapped = false;

	if (XMLPlatformUtils::fgXMLChBigEndian)
	{
        if ((fEncoding == XMLRecognizer::UTF_16L)
        ||  (fEncoding == XMLRecognizer::UCS_4L))
        {
            fSwapped = true;
        }
    }
    else
    {
        if ((fEncoding == XMLRecognizer::UTF_16B)
        ||  (fEncoding == XMLRecognizer::UCS_4B))
        {
            fSwapped = true;
        }
    }
}